

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9a1342::MiniScriptTest::Test
          (MiniScriptTest *this,string *ms,string *hexscript,int mode,KeyConverter *converter,
          int opslimit,int stacklimit,optional<unsigned_int> max_wit_size,
          optional<unsigned_int> stack_exec)

{
  _Rb_tree_header *p_Var1;
  FastRandomContext *__urng;
  ChallengeType CVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  undefined4 uVar6;
  bool bVar7;
  readonly_property<bool> rVar8;
  Availability AVar9;
  int iVar10;
  optional<unsigned_int> oVar11;
  _Base_ptr p_Var12;
  pointer ppVar13;
  _Base_ptr p_Var14;
  result_type_conflict rVar15;
  unsigned_long uVar16;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  size_t sVar17;
  ulong uVar18;
  difference_type dVar19;
  undefined8 uVar20;
  ulong uVar21;
  pair<(anonymous_namespace)::ChallengeType,_unsigned_int> __args_2;
  bool *__args_2_00;
  size_type sVar22;
  unsigned_long uVar23;
  readonly_property<bool> rVar24;
  int *__last;
  int *__first;
  KeyConverter *pKVar25;
  iterator pvVar26;
  _Alloc_node *__node_gen;
  TestSignatureChecker *pTVar27;
  _Alloc_node *p_Var28;
  undefined4 in_register_0000008c;
  iterator pvVar29;
  bool *pbVar30;
  ScriptError *pSVar31;
  uint *puVar32;
  long lVar33;
  pointer ppVar34;
  uint uVar35;
  pair<(anonymous_namespace)::ChallengeType,_unsigned_int> *__cur;
  long lVar36;
  pointer ppVar37;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  Span<const_unsigned_char> script_00;
  pair<unsigned_long,_unsigned_long> pVar38;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar39;
  bool *in_stack_fffffffffffff860;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  NodeRef<typename_KeyConverter::Key> inferred_miniscript;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  NodeRef<typename_KeyConverter::Key> node;
  int opslimit_local;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  ScriptError serror;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  assertion_result local_268;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  bool nonmal_success;
  bool mal_success;
  bool prev_nonmal_success;
  bool prev_mal_success;
  TestSignatureChecker checker;
  bool satisfiable;
  undefined7 uStack_217;
  _Base_ptr p_Stack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  vector<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  challist;
  CScript computed_script;
  CScript script_pubkey;
  __distr_type __d;
  Satisfier satisfier;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  challenges;
  CScript script;
  vector<int,_std::allocator<int>_> results;
  CScriptWitness witness_mal;
  
  pvVar26 = (iterator)CONCAT44(in_register_0000008c,opslimit);
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pKVar25 = converter;
  miniscript::FromString<(anonymous_namespace)::KeyConverter>((string *)&node,(KeyConverter *)ms);
  bVar7 = miniscript::IsTapscript(converter->m_script_ctx);
  if (((mode == 0) || (((byte)mode >> 4 & !bVar7) != 0)) || ((mode & 0x20U) != 0 && bVar7)) {
    local_498 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_490 = "";
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = pvVar26;
    msg.m_begin = (iterator)pKVar25;
    file.m_end = (iterator)0x1c8;
    file.m_begin = (iterator)&local_498;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4a8,msg);
    if (node.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = miniscript::Node<CPubKey>::IsValid
                        (node.
                         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      bVar7 = !bVar7;
    }
    satisfier.super_KeyConverter.m_script_ctx._0_1_ = bVar7;
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Unexpectedly valid: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_4b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4b0 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_4b8,0x1c8);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
  }
  else {
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4c0 = "";
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar26;
    msg_00.m_begin = (iterator)pKVar25;
    file_00.m_end = (iterator)0x1ca;
    file_00.m_begin = (iterator)&local_4c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4d8,
               msg_00);
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         node.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Unparseable: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4e0 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_4e8,0x1ca);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    local_4f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_4f0 = "";
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    local_500 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar29;
    msg_01.m_begin = pvVar26;
    file_01.m_end = (iterator)0x1cb;
    file_01.m_begin = (iterator)&local_4f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_508,
               msg_01);
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         miniscript::Node<CPubKey>::IsValid
                   (node.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Invalid: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_510 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_518,0x1cb);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    local_528 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_520 = "";
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    local_530 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar29;
    msg_02.m_begin = pvVar26;
    file_02.m_end = (iterator)0x1cc;
    file_02.m_begin = (iterator)&local_528;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_538,
               msg_02);
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         miniscript::Node<CPubKey>::IsValidTopLevel
                   (node.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Invalid top level: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_548 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_540 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_548,0x1cc);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              (&computed_script,
               node.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,converter);
    local_558 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_550 = "";
    local_568 = &boost::unit_test::basic_cstring<char_const>::null;
    local_560 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar29;
    msg_03.m_begin = pvVar26;
    file_03.m_end = (iterator)0x1ce;
    file_03.m_begin = (iterator)&local_558;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_568,
               msg_03);
    uVar35 = computed_script.super_CScriptBase._size - 0x1d;
    if (computed_script.super_CScriptBase._size < 0x1d) {
      uVar35 = computed_script.super_CScriptBase._size;
    }
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         (node.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->scriptlen == (ulong)uVar35;
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Script size mismatch: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_578 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_570 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_578,0x1ce);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    bVar7 = std::operator==(hexscript,"?");
    if (!bVar7) {
      local_588 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_580 = "";
      local_598 = &boost::unit_test::basic_cstring<char_const>::null;
      local_590 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_04.m_end = pvVar29;
      msg_04.m_begin = pvVar26;
      file_04.m_end = (iterator)0x1cf;
      file_04.m_begin = (iterator)&local_588;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_598,
                 msg_04);
      sVar22 = computed_script.super_CScriptBase._size - 0x1d;
      uVar20 = computed_script.super_CScriptBase._union.indirect_contents.indirect;
      if (computed_script.super_CScriptBase._size < 0x1d) {
        sVar22 = computed_script.super_CScriptBase._size;
        uVar20 = &computed_script;
      }
      s.m_size._0_4_ = sVar22;
      s.m_data = (uchar *)uVar20;
      s.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)&__d,s);
      local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__d
                           ,hexscript);
      local_268.m_message.px = (element_type *)0x0;
      local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&challist,
                     "Script mismatch: ",ms);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &script_pubkey,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&challist,
                     " (");
      sVar22 = computed_script.super_CScriptBase._size - 0x1d;
      if (computed_script.super_CScriptBase._size < 0x1d) {
        sVar22 = computed_script.super_CScriptBase._size;
        computed_script.super_CScriptBase._union.indirect_contents.indirect =
             (char *)&computed_script;
      }
      s_00.m_size._0_4_ = sVar22;
      s_00.m_data = (uchar *)computed_script.super_CScriptBase._union.indirect_contents.indirect;
      s_00.m_size._4_4_ = 0;
      HexStr_abi_cxx11_((string *)&satisfiable,s_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &script_pubkey,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &satisfiable);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &witness_mal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                     " vs ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &challenges,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &witness_mal,hexscript);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&satisfier
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &challenges,")");
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&PTR__lazy_ostream_01139e30;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_5a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_5a0 = "";
      pvVar26 = &DAT_00000001;
      pvVar29 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                (&local_268,(lazy_ostream *)&results,1,1,WARN,(check_type)in_stack_fffffffffffff860,
                 (size_t)&local_5a8,0x1cf);
      std::__cxx11::string::~string((string *)&satisfier);
      std::__cxx11::string::~string((string *)&challenges);
      std::__cxx11::string::~string((string *)&witness_mal);
      std::__cxx11::string::~string((string *)&script);
      std::__cxx11::string::~string((string *)&satisfiable);
      std::__cxx11::string::~string((string *)&script_pubkey);
      std::__cxx11::string::~string((string *)&challist);
      boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
      std::__cxx11::string::~string((string *)&__d);
    }
    local_5b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_5b0 = "";
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar29;
    msg_05.m_begin = pvVar26;
    file_05.m_end = (iterator)0x1d0;
    file_05.m_begin = (iterator)&local_5b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5c8,
               msg_05);
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         (mode & 2U) == 0 ^
         (char)(((node.
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->typ).m_flags >> 0xc) & TAPSCRIPT;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Malleability mismatch: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_5d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_5d0 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_5d8,0x1d0);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    local_5e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar29;
    msg_06.m_begin = pvVar26;
    file_06.m_end = (iterator)0x1d1;
    file_06.m_begin = (iterator)&local_5e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_5f8,
               msg_06);
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         (mode & 4U) == 0 ^
         (char)(((node.
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->typ).m_flags >> 0xb) & TAPSCRIPT;
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Signature necessity mismatch: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_608 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_600 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_608,0x1d1);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    local_618 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_610 = "";
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    local_620 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = pvVar29;
    msg_07.m_begin = pvVar26;
    file_07.m_end = (iterator)0x1d2;
    file_07.m_begin = (iterator)&local_618;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_628,
               msg_07);
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         (char)((mode & 8U) >> 3) ^
         (char)(((node.
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->typ).m_flags >> 0x12) & TAPSCRIPT;
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Timelock mix mismatch: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_638 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_630 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_638,0x1d2);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((miniscript *)&inferred_miniscript,&computed_script,converter);
    local_658 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_650 = "";
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = pvVar29;
    msg_08.m_begin = pvVar26;
    file_08.m_end = (iterator)0x1d4;
    file_08.m_begin = (iterator)&local_658;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_668,
               msg_08);
    satisfier.super_KeyConverter.m_script_ctx._0_1_ =
         inferred_miniscript.
         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0;
    satisfier.supported._M_t._M_impl._0_8_ = 0;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   "Cannot infer miniscript from script: ",ms);
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139e30;
    local_678 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_670 = "";
    pvVar26 = &DAT_00000001;
    pvVar29 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&satisfier,(lazy_ostream *)&__d,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_678,0x1d4);
    std::__cxx11::string::~string((string *)&results);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&satisfier.supported._M_t._M_impl.super__Rb_tree_header);
    local_688 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_680 = "";
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = pvVar29;
    msg_09.m_begin = pvVar26;
    file_09.m_end = (iterator)0x1d5;
    file_09.m_begin = (iterator)&local_688;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_698,
               msg_09);
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)&__d,
               inferred_miniscript.
               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,converter);
    bVar7 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&__d,
                       &computed_script.super_CScriptBase);
    challenges._M_t._M_impl._0_1_ = bVar7;
    challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    challenges._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&satisfier,
                   "Roundtrip failure: miniscript->script != miniscript->script->miniscript->script: "
                   ,ms);
    results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR__lazy_ostream_01139e30;
    results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_6a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_6a0 = "";
    __node_gen = (_Alloc_node *)&DAT_00000001;
    puVar32 = (uint *)&DAT_00000001;
    __args_2.first = 0x1d5;
    __args_2.second = 0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&challenges,(lazy_ostream *)&results,1,1,WARN,
               (check_type)in_stack_fffffffffffff860,(size_t)&local_6a8,0x1d5);
    std::__cxx11::string::~string((string *)&satisfier);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&__d);
    if (opslimit != -1) {
      local_6b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_6b0 = "";
      local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_10.m_end = (iterator)puVar32;
      msg_10.m_begin = (iterator)__node_gen;
      file_10.m_end = (iterator)0x1d6;
      file_10.m_begin = (iterator)&local_6b8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_6c8,
                 msg_10);
      uVar21 = (ulong)((node.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ops).sat.valid;
      uVar18 = (ulong)(((node.
                         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->ops).sat.value +
                      ((node.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ops).count);
      if (uVar21 == 0) {
        uVar18 = 0;
      }
      _satisfiable = (_Optional_payload_base<unsigned_int>)(uVar21 << 0x20 | uVar18);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(challist.
                             super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,opslimit == (int)uVar18
                            );
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      script.super_CScriptBase._union._16_8_ = &script_pubkey;
      script_pubkey.super_CScriptBase._union.direct[8] = '\0';
      script_pubkey.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      script_pubkey.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
      script_pubkey.super_CScriptBase._24_8_ = anon_var_dwarf_9a5bfe;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&script;
      script.super_CScriptBase._union.direct[8] = '\0';
      script.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&witness_mal;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)witness_mal.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113bf28;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&satisfiable;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      challenges._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113bee8;
      satisfier.supported._M_t._M_impl._0_8_ =
           satisfier.supported._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      satisfier._0_8_ = &PTR__lazy_ostream_0113bea8;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)anon_var_dwarf_9a5bb0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&PTR__lazy_ostream_0113be68;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&satisfier;
      __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
      __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_0113be28;
      local_6d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_6d0 = "";
      __node_gen = (_Alloc_node *)&DAT_00000001;
      puVar32 = (uint *)&DAT_00000001;
      __args_2.first = 0x1d6;
      __args_2.second = 0;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (assertion_result *)&challenges;
      script.super_CScriptBase._24_8_ = ms;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&challist,(lazy_ostream *)&__d,1,1,WARN,
                 (check_type)in_stack_fffffffffffff860,(size_t)&local_6d8,0x1d6);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (stacklimit != -1) {
      local_6e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_6e0 = "";
      local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_11.m_end = (iterator)puVar32;
      msg_11.m_begin = (iterator)__node_gen;
      file_11.m_end = (iterator)0x1d7;
      file_11.m_begin = (iterator)&local_6e8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_6f8,
                 msg_11);
      oVar11 = miniscript::Node<CPubKey>::GetStackSize
                         (node.
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(challist.
                             super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             stacklimit ==
                             oVar11.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      script.super_CScriptBase._union._16_8_ = &script_pubkey;
      script_pubkey.super_CScriptBase._union.direct[8] = '\0';
      script_pubkey.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      script_pubkey.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
      script_pubkey.super_CScriptBase._24_8_ = anon_var_dwarf_9a5c0b;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&script;
      script.super_CScriptBase._union.direct[8] = '\0';
      script.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)witness_mal.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113c0e8;
      script.super_CScriptBase._24_8_ = ms;
      _satisfiable = (_Optional_payload_base<unsigned_int>)
                     miniscript::Node<CPubKey>::GetStackSize
                               (node.
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&satisfiable;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      challenges._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113c0a8;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&witness_mal;
      satisfier.supported._M_t._M_impl._0_8_ =
           satisfier.supported._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      satisfier._0_8_ = &PTR__lazy_ostream_0113c068;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)anon_var_dwarf_9a5bb0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&PTR__lazy_ostream_0113c028;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&satisfier;
      __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
      __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_0113bfe8;
      local_708 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_700 = "";
      __node_gen = (_Alloc_node *)&DAT_00000001;
      puVar32 = (uint *)&DAT_00000001;
      __args_2.first = 0x1d7;
      __args_2.second = 0;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (assertion_result *)&challenges;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&challist,(lazy_ostream *)&__d,1,1,WARN,
                 (check_type)in_stack_fffffffffffff860,(size_t)&local_708,0x1d7);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (max_wit_size.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      local_718 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_710 = "";
      local_728 = &boost::unit_test::basic_cstring<char_const>::null;
      local_720 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_12.m_end = (iterator)puVar32;
      msg_12.m_begin = (iterator)__node_gen;
      file_12.m_end = (iterator)0x1d8;
      file_12.m_begin = (iterator)&local_718;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_728,
                 msg_12);
      uVar21 = (ulong)((node.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ws).sat.valid;
      uVar18 = (ulong)((node.
                        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->ws).sat.value;
      if (uVar21 == 0) {
        uVar18 = 0;
      }
      _satisfiable = (_Optional_payload_base<unsigned_int>)(uVar21 << 0x20 | uVar18);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(challist.
                             super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             max_wit_size.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload._M_value ==
                             (uint)uVar18);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      script.super_CScriptBase._union._16_8_ = &script_pubkey;
      script_pubkey.super_CScriptBase._union.direct[8] = '\0';
      script_pubkey.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      script_pubkey.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
      script_pubkey.super_CScriptBase._24_8_ = anon_var_dwarf_9a5c18;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&script;
      script.super_CScriptBase._union.direct[8] = '\0';
      script.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&witness_mal;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)witness_mal.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113c2a8;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&satisfiable;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      challenges._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113c268;
      satisfier.supported._M_t._M_impl._0_8_ =
           satisfier.supported._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      satisfier._0_8_ = &PTR__lazy_ostream_0113c228;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)anon_var_dwarf_9a5bb0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&PTR__lazy_ostream_0113c1e8;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&satisfier;
      __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
      __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_0113c1a8;
      local_738 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_730 = "";
      __node_gen = (_Alloc_node *)&DAT_00000001;
      puVar32 = (uint *)&DAT_00000001;
      __args_2.first = 0x1d8;
      __args_2.second = 0;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (assertion_result *)&challenges;
      script.super_CScriptBase._24_8_ = ms;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&challist,(lazy_ostream *)&__d,1,1,WARN,
                 (check_type)in_stack_fffffffffffff860,(size_t)&local_738,0x1d8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (stack_exec.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      local_748 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_740 = "";
      local_758 = &boost::unit_test::basic_cstring<char_const>::null;
      local_750 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_13.m_end = (iterator)puVar32;
      msg_13.m_begin = (iterator)__node_gen;
      file_13.m_end = (iterator)0x1d9;
      file_13.m_begin = (iterator)&local_748;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_758,
                 msg_13);
      oVar11 = miniscript::Node<CPubKey>::GetExecStackSize
                         (node.
                          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(challist.
                             super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             stack_exec.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload._M_value ==
                             oVar11.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload);
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      challist.
      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      script.super_CScriptBase._union._16_8_ = &script_pubkey;
      script_pubkey.super_CScriptBase._union.direct[8] = '\0';
      script_pubkey.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      script_pubkey.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
      script_pubkey.super_CScriptBase._24_8_ = anon_var_dwarf_9a5c25;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&script;
      script.super_CScriptBase._union.direct[8] = '\0';
      script.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)witness_mal.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113c428;
      script.super_CScriptBase._24_8_ = ms;
      _satisfiable = (_Optional_payload_base<unsigned_int>)
                     miniscript::Node<CPubKey>::GetExecStackSize
                               (node.
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&satisfiable;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           challenges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      challenges._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113c3e8;
      challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&witness_mal;
      satisfier.supported._M_t._M_impl._0_8_ =
           satisfier.supported._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      satisfier._0_8_ = &PTR__lazy_ostream_0113c3a8;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)anon_var_dwarf_9a5bb0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)&PTR__lazy_ostream_0113c368;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&satisfier;
      __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
      __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_0113c328;
      local_768 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_760 = "";
      __node_gen = (_Alloc_node *)&DAT_00000001;
      puVar32 = (uint *)&DAT_00000001;
      __args_2.first = 0x1d9;
      __args_2.second = 0;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (assertion_result *)&challenges;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&challist,(lazy_ostream *)&__d,1,1,WARN,
                 (check_type)in_stack_fffffffffffff860,(size_t)&local_768,0x1d9);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              (&script,node.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,converter);
    FindChallenges(&challenges,&node);
    p_Var14 = challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &challenges._M_t._M_impl.super__Rb_tree_header;
    challist.
    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    challist.
    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    challist.
    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar36 = 0;
    lVar33 = 0;
    p_Var12 = challenges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var12 != p_Var1) {
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      lVar33 = lVar33 + -8;
      lVar36 = lVar36 + -1;
    }
    if ((ulong)-lVar36 >> 0x3c != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        uVar20 = std::__throw_length_error("cannot create std::vector larger than max_size()");
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &challist.
                    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&inferred_miniscript.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&computed_script.super_CScriptBase);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&node.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
          _Unwind_Resume(uVar20);
        }
      }
      goto LAB_003b9bd3;
    }
    if (lVar36 == 0) {
      ppVar13 = (pointer)0x0;
    }
    else {
      ppVar13 = (pointer)operator_new(-lVar33);
    }
    challist.
    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppVar13 - lVar33);
    challist.
    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar13;
    while ((_Rb_tree_header *)p_Var14 != p_Var1) {
      uVar6 = *(undefined4 *)&p_Var14[1].field_0x4;
      ppVar13->first = p_Var14[1]._M_color;
      ppVar13->second = uVar6;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      ppVar13 = ppVar13 + 1;
    }
    __urng = &(this->super_BasicTestingSetup).m_rng;
    challist.
    super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
    for (iVar10 = 0;
        ppVar34 = challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppVar13 = challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, iVar10 != 3; iVar10 = iVar10 + 1) {
      if (challist.
          super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          challist.
          super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __args_2.first = ~(PK|RIPEMD160);
        __args_2.second = 7;
        if ((ulong)((long)challist.
                          super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)challist.
                         super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x7fffffff9) {
          if (((long)challist.
                     super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)challist.
                     super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start & 8U) == 0) {
            __d._M_param._M_a = 0;
            __d._M_param._M_b = 1;
            rVar15 = std::uniform_int_distribution<unsigned_long>::operator()(&__d,__urng);
            ppVar37 = ppVar13 + 2;
            __args_2 = ppVar13[1];
            ppVar13[1] = ppVar13[rVar15];
            ppVar13[rVar15] = __args_2;
          }
          else {
            ppVar37 = challist.
                      super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar33 = (long)ppVar37 - (long)ppVar13;
          for (; ppVar37 != ppVar34; ppVar37 = ppVar37 + 2) {
            pVar38 = std::__gen_two_uniform_ints<unsigned_long,FastRandomContext&>
                               ((lVar33 >> 3) + 1,(lVar33 >> 3) + 2,__urng);
            uVar23 = pVar38.second;
            uVar16 = pVar38.first;
            CVar2 = ppVar37->first;
            ppVar37->first = ppVar13[uVar16].first;
            ppVar13[uVar16].first = CVar2;
            uVar35 = ppVar37->second;
            ppVar37->second = ppVar13[uVar16].second;
            ppVar13[uVar16].second = uVar35;
            CVar2 = ppVar37[1].first;
            ppVar37[1].first = ppVar13[uVar23].first;
            ppVar13[uVar23].first = CVar2;
            uVar35 = ppVar37[1].second;
            __args_2.second = 0;
            __args_2.first = ppVar13[uVar23].second;
            ppVar37[1].second = ppVar13[uVar23].second;
            ppVar13[uVar23].second = uVar35;
            lVar33 = lVar33 + 0x10;
          }
        }
        else {
          __d._M_param._M_a = 0;
          __d._M_param._M_b = 0xffffffffffffffff;
          for (lVar33 = 8; (pointer)((long)&ppVar13->first + lVar33) != ppVar34; lVar33 = lVar33 + 8
              ) {
            results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)(lVar33 >> 3);
            results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            rVar15 = std::uniform_int_distribution<unsigned_long>::operator()
                               (&__d,__urng,(param_type *)&results);
            CVar2 = *(ChallengeType *)((long)&ppVar13->first + lVar33);
            *(ChallengeType *)((long)&ppVar13->first + lVar33) = ppVar13[rVar15].first;
            ppVar13[rVar15].first = CVar2;
            uVar35 = *(uint *)((long)&ppVar13->second + lVar33);
            __args_2.second = 0;
            __args_2.first = uVar35;
            *(uint *)((long)&ppVar13->second + lVar33) = ppVar13[rVar15].second;
            ppVar13[rVar15].second = uVar35;
          }
        }
      }
      satisfier.super_KeyConverter.m_script_ctx = converter->m_script_ctx;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      checker.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
           (_func_int **)&PTR_CheckECDSASignature_0113c4e8;
      checker.ctx = &satisfier;
      prev_mal_success = false;
      prev_nonmal_success = false;
      uVar35 = 0xffffffff;
      satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           satisfier.supported._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        pbVar30 = (bool *)&DAT_00000001;
        if ((int)((ulong)((long)ppVar34 - (long)ppVar13) >> 3) <= (int)uVar35) break;
        if (-1 < (int)uVar35) {
          pVar39 = std::
                   _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                   ::_M_get_insert_unique_pos(&satisfier.supported._M_t,ppVar13 + uVar35);
          if (pVar39.second != (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
            ::
            _M_insert_<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>const&,std::_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>::_Alloc_node>
                      ((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                        *)&satisfier.supported,pVar39.first,pVar39.second,ppVar13 + uVar35,
                       __node_gen);
          }
        }
        __d._M_param._M_a = CONCAT71(__d._M_param._M_a._1_7_,1);
        __d._M_param._M_b = 0;
        bVar7 = miniscript::IsTapscript(converter->m_script_ctx);
        if (bVar7) {
          sVar22 = script.super_CScriptBase._size - 0x1d;
          uVar20 = script.super_CScriptBase._union.indirect_contents.indirect;
          if (script.super_CScriptBase._size < 0x1d) {
            sVar22 = script.super_CScriptBase._size;
            uVar20 = &script;
          }
          __node_gen = (_Alloc_node *)0xc0;
          script_00.m_size._0_4_ = sVar22;
          script_00.m_data = (uchar *)uVar20;
          script_00.m_size._4_4_ = 0;
          TaprootBuilder::Add((TaprootBuilder *)&__d,0,script_00,0xc0,true);
          TaprootBuilder::Finalize((TaprootBuilder *)&__d,&XOnlyPubKey::NUMS_H);
          TaprootBuilder::GetOutput((WitnessV1Taproot *)&witness_mal,(TaprootBuilder *)&__d);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)witness_mal.stack.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)witness_mal.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)witness_mal.stack.
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          GetScriptForDestination(&script_pubkey,(CTxDestination *)&results);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&results);
          puVar32 = (uint *)pbVar30;
        }
        else {
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          this_00 = CScript::operator<<((CScript *)&results,OP_0);
          WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&witness_mal,&script);
          b._M_extent._M_extent_value = 0x20;
          b._M_ptr = (pointer)&witness_mal;
          other = &CScript::operator<<(this_00,b)->super_CScriptBase;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                    (&script_pubkey.super_CScriptBase,other);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&results);
        }
        witness_mal.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        witness_mal.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        witness_mal.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        AVar9 = miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
                          (node.
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&satisfier,
                           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&witness_mal,false);
        mal_success = AVar9 == YES;
        SatisfactionToWitness(converter->m_script_ctx,&witness_mal,&script,(TaprootBuilder *)&__d);
        _satisfiable = (_Storage<unsigned_int,_true>)0x0;
        uStack_217._3_1_ = false;
        uStack_217._4_3_ = 0;
        p_Stack_210 = (_Base_ptr)0x0;
        local_208._M_allocated_capacity = 0;
        AVar9 = miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
                          (node.
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&satisfier,
                           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&satisfiable,true);
        nonmal_success = AVar9 == YES;
        sVar17 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                           ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&satisfiable);
        uVar18 = ((long)p_Stack_210 - (long)_satisfiable) / 0x18;
        lVar33 = -1;
        if ((0xfc < uVar18) && (lVar33 = -3, 0xffff < uVar18)) {
          lVar33 = (ulong)(uVar18 >> 0x20 == 0) * 4 + -9;
        }
        SatisfactionToWitness
                  (converter->m_script_ctx,(CScriptWitness *)&satisfiable,&script,
                   (TaprootBuilder *)&__d);
        if (nonmal_success == true) {
          oVar11 = miniscript::Node<CPubKey>::GetStackSize
                             (node.
                              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          bVar7 = miniscript::IsTapscript(converter->m_script_ctx);
          local_240 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_238 = "";
          local_250 = &boost::unit_test::basic_cstring<char_const>::null;
          local_248 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_14.m_end = (iterator)puVar32;
          msg_14.m_begin = (iterator)__node_gen;
          file_14.m_end = (iterator)0x17e;
          file_14.m_begin = (iterator)&local_240;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_250,msg_14);
          local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 ((ulong)(((long)p_Stack_210 - (long)_satisfiable) / 0x18) <=
                 (ulong)(oVar11.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload + (uint)bVar7 + 1));
          local_268.m_message.px = (element_type *)0x0;
          local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_278 = "witness_nonmal.stack.size() <= max_stack_size";
          local_270 = "";
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_0113a070;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_288 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_280 = "";
          pvVar26 = &DAT_00000001;
          pvVar29 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_268,(lazy_ostream *)&results,1,0,WARN,
                     (check_type)in_stack_fffffffffffff860,(size_t)&local_288,0x17e);
          boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
          local_298 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_290 = "";
          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_15.m_end = pvVar29;
          msg_15.m_begin = pvVar26;
          file_15.m_end = (iterator)0x180;
          file_15.m_begin = (iterator)&local_298;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_2a8,msg_15);
          local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)mal_success;
          local_268.m_message.px = (element_type *)0x0;
          local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_278 = "mal_success";
          local_270 = "";
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_0113a070;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_2b8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_2b0 = "";
          pvVar26 = &DAT_00000001;
          pvVar29 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_268,(lazy_ostream *)&results,1,0,WARN,
                     (check_type)in_stack_fffffffffffff860,(size_t)&local_2b8,0x180);
          boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
          local_2c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_2c0 = "";
          local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_16.m_end = pvVar29;
          msg_16.m_begin = pvVar26;
          file_16.m_end = (iterator)0x181;
          file_16.m_begin = (iterator)&local_2c8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_2d8,msg_16);
          local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 std::operator==((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&satisfiable,&witness_mal.stack);
          local_268.m_message.px = (element_type *)0x0;
          local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_278 = "witness_nonmal.stack == witness_mal.stack";
          local_270 = "";
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_0113a070;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_2e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_2e0 = "";
          boost::test_tools::tt_detail::report_assertion
                    (&local_268,(lazy_ostream *)&results,1,0,WARN,
                     (check_type)in_stack_fffffffffffff860,(size_t)&local_2e8,0x181);
          boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
          uVar18 = (ulong)((node.
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->ws).sat.value;
          if (((node.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->ws).sat.valid == false) {
            uVar18 = 0;
          }
          if (uVar18 < lVar33 + sVar17) {
            __assert_fail("wit_size <= *node->GetWitnessSize()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                          ,0x182,
                          "void (anonymous namespace)::MiniScriptTest::TestSatisfy(const KeyConverter &, const std::string &, const NodeRef &)"
                         );
          }
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          pTVar27 = &checker;
          pSVar31 = &serror;
          rVar8.super_class_property<bool>.value =
               (class_property<bool>)
               VerifyScript((CScript *)&results,&script_pubkey,(CScriptWitness *)&satisfiable,
                            0x1fffdf,&pTVar27->super_BaseSignatureChecker,pSVar31);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&results);
          bVar7 = miniscript::Node<CPubKey>::ValidSatisfactions
                            (node.
                             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          if (bVar7) {
            local_300 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_2f8 = "";
            local_310 = &boost::unit_test::basic_cstring<char_const>::null;
            local_308 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_17.m_end = (iterator)pSVar31;
            msg_17.m_begin = (iterator)pTVar27;
            file_17.m_end = (iterator)0x188;
            file_17.m_begin = (iterator)&local_300;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                       (size_t)&local_310,msg_17);
            local_268.m_message.px = (element_type *)0x0;
            local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_278 = "res";
            local_270 = "";
            results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish &
                                 0xffffffffffffff00);
            results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)&PTR__lazy_ostream_0113a070;
            results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
            local_320 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
            ;
            local_318 = "";
            pTVar27 = (TestSignatureChecker *)&DAT_00000001;
            pSVar31 = (ScriptError *)0x0;
            local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)
                    (readonly_property<bool>)rVar8.super_class_property<bool>.value;
            boost::test_tools::tt_detail::report_assertion
                      (&local_268,(lazy_ostream *)&results,1,0,WARN,
                       (check_type)in_stack_fffffffffffff860,(size_t)&local_320,0x188);
            boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
          }
          local_330 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_328 = "";
          local_340 = &boost::unit_test::basic_cstring<char_const>::null;
          local_338 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_18.m_end = (iterator)pSVar31;
          msg_18.m_begin = (iterator)pTVar27;
          file_18.m_end = (iterator)0x18d;
          file_18.m_begin = (iterator)&local_330;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                     (size_t)&local_340,msg_18);
          rVar24.super_class_property<bool>.value = (class_property<bool>)true;
          if ((!(bool)rVar8.super_class_property<bool>.value) &&
             (bVar7 = miniscript::Node<CPubKey>::CheckOpsLimit
                                (node.
                                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr), bVar7 || serror != SCRIPT_ERR_OP_COUNT)) {
            bVar7 = miniscript::Node<CPubKey>::CheckStackSize
                              (node.
                               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
            rVar24.super_class_property<bool>.value =
                 (class_property<bool>)(~bVar7 & serror == SCRIPT_ERR_STACK_SIZE);
          }
          local_268.m_message.px = (element_type *)0x0;
          local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_278 = 
          "res || (!node->CheckOpsLimit() && serror == ScriptError::SCRIPT_ERR_OP_COUNT) || (!node->CheckStackSize() && serror == ScriptError::SCRIPT_ERR_STACK_SIZE)"
          ;
          local_270 = "";
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_0113a070;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_350 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_348 = "";
          __node_gen = (_Alloc_node *)&DAT_00000001;
          puVar32 = (uint *)0x0;
          local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)rVar24.super_class_property<bool>.value;
          boost::test_tools::tt_detail::report_assertion
                    (&local_268,(lazy_ostream *)&results,1,0,WARN,
                     (check_type)in_stack_fffffffffffff860,(size_t)&local_350,0x18d);
          boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
        }
        if ((mal_success == true) &&
           ((nonmal_success != true ||
            (bVar7 = std::operator==(&witness_mal.stack,
                                     (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&satisfiable), !bVar7)))) {
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          pTVar27 = &checker;
          pSVar31 = &serror;
          bVar7 = VerifyScript((CScript *)&results,&script_pubkey,&witness_mal,0x1fffdf,
                               &pTVar27->super_BaseSignatureChecker,pSVar31);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&results);
          local_360 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_358 = "";
          local_370 = &boost::unit_test::basic_cstring<char_const>::null;
          local_368 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_19.m_end = (iterator)pSVar31;
          msg_19.m_begin = (iterator)pTVar27;
          file_19.m_end = (iterator)0x196;
          file_19.m_begin = (iterator)&local_360;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                     (size_t)&local_370,msg_19);
          local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (bVar7 || (serror & ~SCRIPT_ERR_UNKNOWN_ERROR) == SCRIPT_ERR_OP_COUNT);
          local_268.m_message.px = (element_type *)0x0;
          local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_278 = 
          "res || serror == ScriptError::SCRIPT_ERR_OP_COUNT || serror == ScriptError::SCRIPT_ERR_STACK_SIZE"
          ;
          local_270 = "";
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_0113a070;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_380 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_378 = "";
          __node_gen = (_Alloc_node *)&DAT_00000001;
          puVar32 = (uint *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_268,(lazy_ostream *)&results,1,0,WARN,
                     (check_type)in_stack_fffffffffffff860,(size_t)&local_380,0x196);
          boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
        }
        bVar7 = miniscript::Node<CPubKey>::IsSane
                          (node.
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (bVar7) {
          local_390 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_388 = "";
          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_398 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_20.m_end = (iterator)puVar32;
          msg_20.m_begin = (iterator)__node_gen;
          file_20.m_end = (iterator)0x19b;
          file_20.m_begin = (iterator)&local_390;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                     (size_t)&local_3a0,msg_20);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_01139f30;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_3b0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_3a8 = "";
          in_stack_fffffffffffff860 = &nonmal_success;
          __node_gen = (_Alloc_node *)0x2;
          puVar32 = (uint *)&mal_success;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                    (&results,&local_3b0,0x19b,1,2,puVar32,"mal_success",in_stack_fffffffffffff860,
                     "nonmal_success");
        }
        local_3c0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
        ;
        local_3b8 = "";
        local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_21.m_end = (iterator)puVar32;
        msg_21.m_begin = (iterator)__node_gen;
        file_21.m_end = (iterator)0x19f;
        file_21.m_begin = (iterator)&local_3c0;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_3d0
                   ,msg_21);
        local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(prev_mal_success <= mal_success);
        local_268.m_message.px = (element_type *)0x0;
        local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_278 = "mal_success >= prev_mal_success";
        local_270 = "";
        results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&PTR__lazy_ostream_0113a070;
        results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
        local_3e0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
        ;
        local_3d8 = "";
        __node_gen = (_Alloc_node *)&DAT_00000001;
        puVar32 = (uint *)0x0;
        uVar20 = 0x19f;
        boost::test_tools::tt_detail::report_assertion
                  (&local_268,(lazy_ostream *)&results,1,0,WARN,
                   (check_type)in_stack_fffffffffffff860,(size_t)&local_3e0,0x19f);
        boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
        bVar7 = miniscript::Node<CPubKey>::IsSane
                          (node.
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        __args_2._1_7_ = (undefined7)((ulong)uVar20 >> 8);
        __args_2.first._0_1_ = (int)uVar35 < 0 || bVar7;
        if ((__args_2.first._0_1_) ||
           (challist.
            super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar35].first == PK)) {
          local_3f0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_3e8 = "";
          local_400 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_22.m_end = (iterator)puVar32;
          msg_22.m_begin = (iterator)__node_gen;
          file_22.m_end = (iterator)0x1a4;
          file_22.m_begin = (iterator)&local_3f0;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                     (size_t)&local_400,msg_22);
          local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(prev_nonmal_success <= nonmal_success);
          local_268.m_message.px = (element_type *)0x0;
          local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_278 = "nonmal_success >= prev_nonmal_success";
          local_270 = "";
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)results.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__lazy_ostream_0113a070;
          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
          local_410 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
          ;
          local_408 = "";
          __node_gen = (_Alloc_node *)&DAT_00000001;
          puVar32 = (uint *)0x0;
          __args_2.first = 0x1a4;
          __args_2.second = 0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_268,(lazy_ostream *)&results,1,0,WARN,
                     (check_type)in_stack_fffffffffffff860,(size_t)&local_410,0x1a4);
          boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
        }
        ppVar13 = challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        prev_mal_success = mal_success;
        prev_nonmal_success = nonmal_success;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&satisfiable);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&witness_mal.stack);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&script_pubkey.super_CScriptBase);
        std::
        vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ::~vector((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                   *)&__d._M_param._M_b);
        uVar35 = uVar35 + 1;
        ppVar34 = challist.
                  super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      __d._M_param._M_a = 0;
      __d._M_param._M_b = 0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      witness_mal.stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)witness_mal.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::
      vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1})const::{lambda(miniscript::Node<CPubKey>const&,Span<int>)#1}>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st...<int>)#1}>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)#1})const::StackElem>>
      ::
      emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_)const::DummyState>
                ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st___<int>)_1_>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)_1_)const::StackElem>>
                  *)&__d,node.
                         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(int *)&witness_mal,(bool *)__args_2);
      while (uVar16 = __d._M_param._M_b, __d._M_param._M_b != __d._M_param._M_a) {
        puVar5 = *(uint **)(__d._M_param._M_b - 0x18);
        pbVar30 = *(bool **)(__d._M_param._M_b - 0x10);
        lVar33 = *(long *)(puVar5 + 0xe);
        lVar36 = *(long *)(puVar5 + 0x10) - lVar33;
        __args_2_00 = (bool *)(lVar36 >> 4);
        if (pbVar30 < __args_2_00) {
          *(bool **)(__d._M_param._M_b - 0x10) = pbVar30 + 1;
          witness_mal.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)witness_mal.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          std::
          vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1})const::{lambda(miniscript::Node<CPubKey>const&,Span<int>)#1}>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::{lambda(miniscript::Node<CPubKey>const&)#1}>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st...<int>)#1}>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)#1})const::StackElem>>
          ::
          emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_)const::DummyState>
                    ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<int,miniscript::Node<CPubKey>::TreeEval<int,miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_)const::_lambda(miniscript::Node<CPubKey>const&,Span<int>)_1_>(miniscript::Node<CPubKey>::IsSatisfiable<(anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,std::__cxx11::string_const&,std::shared_ptr<miniscript::Node<CPubKey>const>const&)::_lambda(miniscript::Node<CPubKey>const&)_1_>((anonymous_namespace)::MiniScriptTest::TestSatisfy((anonymous_namespace)::KeyConverter_const&,st___<int>)_1_>(auto:2)const::DummyState,miniscript::Node<CPubKey>const&,Span<int>)_1_)const::StackElem>>
                      *)&__d,*(Node<CPubKey> **)(lVar33 + (long)pbVar30 * 0x10),(int *)&witness_mal,
                     __args_2_00);
        }
        else {
          if ((bool *)((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) < __args_2_00) {
            __assert_fail("results.size() >= node.subs.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                          ,0x273,
                          "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = int, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                         );
          }
          __last = (int *)((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                          ((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
          __first = __last + -(long)__args_2_00;
          p_Var28 = (_Alloc_node *)(ulong)*puVar5;
          __node_gen = p_Var28;
          if ((_Alloc_node *)&DAT_0000001a < p_Var28) {
switchD_003b938c_caseD_a:
            if (lVar36 != 0x10) {
              __assert_fail("subs.size() == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                            ,0x62f,
                            "auto miniscript::Node<CPubKey>::IsSatisfiable((lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp:427:48))::(anonymous class)::operator()(const Node<Key> &, Span<int>) const [Key = CPubKey]"
                           );
            }
            bVar7 = *__first != 0;
            lVar36 = 0x10;
          }
          else {
            bVar7 = false;
            puVar32 = &switchD_003b938c::switchdataD_00ba0cec;
            __node_gen = (_Alloc_node *)
                         ((long)&switchD_003b938c::switchdataD_00ba0cec +
                         (long)(int)(&switchD_003b938c::switchdataD_00ba0cec)[(long)p_Var28]);
            switch(p_Var28) {
            case (_Alloc_node *)0x0:
              break;
            default:
              bVar7 = true;
              break;
            case (_Alloc_node *)0xa:
            case (_Alloc_node *)0xb:
            case (_Alloc_node *)0xc:
            case (_Alloc_node *)0xd:
            case (_Alloc_node *)0xe:
            case (_Alloc_node *)0xf:
            case (_Alloc_node *)0x10:
              goto switchD_003b938c_caseD_a;
            case (_Alloc_node *)0x11:
            case (_Alloc_node *)0x12:
              if (*__first == 0) {
                bVar7 = false;
              }
              else {
LAB_003b93a2:
                iVar3 = __first[1];
LAB_003b93a6:
                bVar7 = iVar3 != 0;
              }
              break;
            case (_Alloc_node *)0x13:
            case (_Alloc_node *)0x14:
            case (_Alloc_node *)0x15:
            case (_Alloc_node *)0x16:
              bVar7 = true;
              if (*__first == 0) goto LAB_003b93a2;
              break;
            case (_Alloc_node *)0x17:
              if ((*__first == 0) || (bVar7 = true, __first[1] == 0)) {
                iVar3 = __first[2];
                goto LAB_003b93a6;
              }
              break;
            case (_Alloc_node *)0x18:
              script_pubkey.super_CScriptBase._union.direct[0] = 1;
              dVar19 = std::__count_if<int*,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                                 (__first,__last,(_Iter_equals_val<const_bool>)&script_pubkey);
              bVar7 = puVar5[1] <= (uint)dVar19;
              lVar36 = *(long *)(puVar5 + 0x10) - *(long *)(puVar5 + 0xe);
            }
          }
          witness_mal.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)bVar7 | 0x100000000);
          std::vector<int,_std::allocator<int>_>::erase
                    (&results,(int *)((long)results.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (lVar36 >> 2)),
                     (const_iterator)
                     results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&results,(int *)&witness_mal);
          __d._M_param._M_b = uVar16 - 0x18;
        }
      }
      if ((long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 4) {
        __assert_fail("results.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x27e,
                      "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = int, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                     );
      }
      iVar3 = *results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&results.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<StackElem,_std::allocator<StackElem>_>::~vector
                ((vector<StackElem,_std::allocator<StackElem>_> *)&__d);
      satisfiable = iVar3 != 0;
      local_420 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_418 = "";
      local_430 = &boost::unit_test::basic_cstring<char_const>::null;
      local_428 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_23.m_end = (iterator)puVar32;
      msg_23.m_begin = (iterator)__node_gen;
      file_23.m_end = (iterator)0x1ad;
      file_23.m_begin = (iterator)&local_420;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_430,
                 msg_23);
      __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
      __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139f30;
      local_440 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
      ;
      local_438 = "";
      in_stack_fffffffffffff860 = &satisfiable;
      __args_2.first = RIPEMD160;
      __args_2.second = 0;
      __node_gen = (_Alloc_node *)0x2;
      puVar32 = (uint *)&prev_mal_success;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                ((TaprootBuilder *)&__d,&local_440,0x1ad);
      bVar7 = miniscript::Node<CPubKey>::IsSane
                        (node.
                         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (bVar7) {
        local_450 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
        ;
        local_448 = "";
        local_460 = &boost::unit_test::basic_cstring<char_const>::null;
        local_458 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_24.m_end = (iterator)puVar32;
        msg_24.m_begin = (iterator)__node_gen;
        file_24.m_end = (iterator)0x1af;
        file_24.m_begin = (iterator)&local_450;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_460
                   ,msg_24);
        __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
        __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_01139f30;
        local_470 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
        ;
        local_468 = "";
        in_stack_fffffffffffff860 = &satisfiable;
        __args_2.first = RIPEMD160;
        __args_2.second = 0;
        __node_gen = (_Alloc_node *)0x2;
        puVar32 = (uint *)&prev_nonmal_success;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                  ((TaprootBuilder *)&__d,&local_470,0x1af);
      }
      std::
      set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
      ::~set(&satisfier.supported);
    }
    std::
    _Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::~_Vector_base(&challist.
                     super__Vector_base<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                   );
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::~set(&challenges);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&inferred_miniscript.
                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&computed_script.super_CScriptBase)
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&node.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_003b9bd3:
  __stack_chk_fail();
}

Assistant:

void Test(const std::string& ms, const std::string& hexscript, int mode, const KeyConverter& converter,
          int opslimit = -1, int stacklimit = -1, std::optional<uint32_t> max_wit_size = std::nullopt,
          std::optional<uint32_t> stack_exec = {})
{
    auto node = miniscript::FromString(ms, converter);
    const bool is_tapscript{miniscript::IsTapscript(converter.MsContext())};
    if (mode == TESTMODE_INVALID || ((mode & TESTMODE_P2WSH_INVALID) && !is_tapscript) || ((mode & TESTMODE_TAPSCRIPT_INVALID) && is_tapscript)) {
        BOOST_CHECK_MESSAGE(!node || !node->IsValid(), "Unexpectedly valid: " + ms);
    } else {
        BOOST_CHECK_MESSAGE(node, "Unparseable: " + ms);
        BOOST_CHECK_MESSAGE(node->IsValid(), "Invalid: " + ms);
        BOOST_CHECK_MESSAGE(node->IsValidTopLevel(), "Invalid top level: " + ms);
        auto computed_script = node->ToScript(converter);
        BOOST_CHECK_MESSAGE(node->ScriptSize() == computed_script.size(), "Script size mismatch: " + ms);
        if (hexscript != "?") BOOST_CHECK_MESSAGE(HexStr(computed_script) == hexscript, "Script mismatch: " + ms + " (" + HexStr(computed_script) + " vs " + hexscript + ")");
        BOOST_CHECK_MESSAGE(node->IsNonMalleable() == !!(mode & TESTMODE_NONMAL), "Malleability mismatch: " + ms);
        BOOST_CHECK_MESSAGE(node->NeedsSignature() == !!(mode & TESTMODE_NEEDSIG), "Signature necessity mismatch: " + ms);
        BOOST_CHECK_MESSAGE((node->GetType() << "k"_mst) == !(mode & TESTMODE_TIMELOCKMIX), "Timelock mix mismatch: " + ms);
        auto inferred_miniscript = miniscript::FromScript(computed_script, converter);
        BOOST_CHECK_MESSAGE(inferred_miniscript, "Cannot infer miniscript from script: " + ms);
        BOOST_CHECK_MESSAGE(inferred_miniscript->ToScript(converter) == computed_script, "Roundtrip failure: miniscript->script != miniscript->script->miniscript->script: " + ms);
        if (opslimit != -1) BOOST_CHECK_MESSAGE((int)*node->GetOps() == opslimit, "Ops limit mismatch: " << ms << " (" << *node->GetOps() << " vs " << opslimit << ")");
        if (stacklimit != -1) BOOST_CHECK_MESSAGE((int)*node->GetStackSize() == stacklimit, "Stack limit mismatch: " << ms << " (" << *node->GetStackSize() << " vs " << stacklimit << ")");
        if (max_wit_size) BOOST_CHECK_MESSAGE(*node->GetWitnessSize() == *max_wit_size, "Witness size limit mismatch: " << ms << " (" << *node->GetWitnessSize() << " vs " << *max_wit_size << ")");
        if (stack_exec) BOOST_CHECK_MESSAGE(*node->GetExecStackSize() == *stack_exec, "Stack execution limit mismatch: " << ms << " (" << *node->GetExecStackSize() << " vs " << *stack_exec << ")");
        TestSatisfy(converter, ms, node);
    }
}